

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_labeltype.cxx
# Opt level: O0

void __thiscall Fl_Label::measure(Fl_Label *this,int *W,int *H)

{
  Fl_Label_Measure_F *local_28;
  Fl_Label_Measure_F *f;
  int *H_local;
  int *W_local;
  Fl_Label *this_local;
  
  if ((this->value == (char *)0x0) && (this->image == (Fl_Image *)0x0)) {
    *H = 0;
    *W = 0;
  }
  else {
    local_28 = ::measure[this->type];
    if (local_28 == (Fl_Label_Measure_F *)0x0) {
      local_28 = fl_normal_measure;
    }
    (*local_28)(this,W,H);
  }
  return;
}

Assistant:

void Fl_Label::measure(int& W, int& H) const {
  if (!value && !image) {
    W = H = 0;
    return;
  }

  Fl_Label_Measure_F* f = ::measure[type]; if (!f) f = fl_normal_measure;
  f(this, W, H);
}